

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_send_detach(LINK_ENDPOINT_HANDLE link_endpoint,DETACH_HANDLE detach)

{
  int iVar1;
  AMQP_VALUE performative;
  AMQP_VALUE detach_performative_value;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  int result;
  DETACH_HANDLE detach_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if ((link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) || (detach == (DETACH_HANDLE)0x0)) {
    link_endpoint_instance._4_4_ = 0x582;
  }
  else {
    iVar1 = detach_set_handle(detach,link_endpoint->output_handle);
    if (iVar1 == 0) {
      performative = amqpvalue_create_detach(detach);
      if (performative == (AMQP_VALUE)0x0) {
        link_endpoint_instance._4_4_ = 0x591;
      }
      else {
        iVar1 = encode_frame(link_endpoint,performative,(PAYLOAD *)0x0,0);
        if (iVar1 == 0) {
          link_endpoint_instance._4_4_ = 0;
        }
        else {
          link_endpoint_instance._4_4_ = 0x597;
        }
        amqpvalue_destroy(performative);
      }
    }
    else {
      link_endpoint_instance._4_4_ = 0x58a;
    }
  }
  return link_endpoint_instance._4_4_;
}

Assistant:

int session_send_detach(LINK_ENDPOINT_HANDLE link_endpoint, DETACH_HANDLE detach)
{
    int result;

    if ((link_endpoint == NULL) ||
        (detach == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;

        if (detach_set_handle(detach, link_endpoint_instance->output_handle) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE detach_performative_value = amqpvalue_create_detach(detach);
            if (detach_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (encode_frame(link_endpoint, detach_performative_value, NULL, 0) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(detach_performative_value);
            }
        }
    }

    return result;
}